

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O1

Vector3d * __thiscall
VCClusterQuad::center(Vector3d *__return_storage_ptr__,VCClusterQuad *this,Matrix4d *E)

{
  double dVar1;
  int iVar2;
  undefined1 auVar3 [16];
  Vector3d x;
  double local_28;
  double dStack_20;
  double local_18;
  
  iVar2 = (**(this->super_VCIQuad)._vptr_VCIQuad)(&this->super_VCIQuad,E,&local_28);
  if ((char)iVar2 == '\0') {
    dVar1 = (this->super_VCCluster).area;
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      auVar3._8_8_ = dVar1;
      auVar3._0_8_ = dVar1;
      auVar3 = divpd(*(undefined1 (*) [16])
                      (this->super_VCCluster).weightedSum.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array,auVar3);
      *(undefined1 (*) [16])
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
       m_storage.m_data.array = auVar3;
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
      m_storage.m_data.array[2] =
           (this->super_VCCluster).weightedSum.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] /
           dVar1;
    }
    else {
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
      m_storage.m_data.array[0] = 0.0;
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
      m_storage.m_data.array[1] = 0.0;
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
      m_storage.m_data.array[2] = 0.0;
    }
  }
  else {
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[2] = local_18;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[0] = local_28;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[1] = dStack_20;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[0] = local_28;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[1] = dStack_20;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[2] = local_18;
  }
  return __return_storage_ptr__;
}

Assistant:

Vector3d VCClusterQuad::center(const Matrix4d& E) {
	Vector3d x;
	if (solveQuadMetric(E, x))
		return x;
	return VCCluster::center();
}